

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::Relation::Bind(BoundStatement *__return_storage_ptr__,Relation *this,Binder *binder)

{
  long *plVar1;
  SelectStatement stmt;
  long *local_a0;
  SQLStatement local_98;
  long *local_20;
  
  local_98.named_param_map._M_h._M_buckets = &local_98.named_param_map._M_h._M_single_bucket;
  local_98.type = SELECT_STATEMENT;
  local_98.stmt_location = 0;
  local_98.stmt_length = 0;
  local_98.named_param_map._M_h._M_bucket_count = 1;
  local_98.named_param_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_98.named_param_map._M_h._M_element_count = 0;
  local_98.named_param_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_98.named_param_map._M_h._M_rehash_policy._M_next_resize = 0;
  local_98.named_param_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_98.query._M_dataplus._M_p = (pointer)&local_98.query.field_2;
  local_98.query._M_string_length = 0;
  local_98.query.field_2._M_local_buf[0] = '\0';
  local_98._vptr_SQLStatement = (_func_int **)&PTR__SelectStatement_02492f28;
  local_20 = (long *)0x0;
  (*this->_vptr_Relation[3])(&local_a0);
  plVar1 = local_20;
  local_20 = local_a0;
  local_a0 = (long *)0x0;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  if (local_a0 != (long *)0x0) {
    (**(code **)(*local_a0 + 8))();
  }
  Binder::Bind(__return_storage_ptr__,binder,&local_98);
  local_98._vptr_SQLStatement = (_func_int **)&PTR__SelectStatement_02492f28;
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  local_20 = (long *)0x0;
  SQLStatement::~SQLStatement(&local_98);
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Relation::Bind(Binder &binder) {
	SelectStatement stmt;
	stmt.node = GetQueryNode();
	return binder.Bind(stmt.Cast<SQLStatement>());
}